

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLMatrix33.cpp
# Opt level: O1

Matrix33 * AML::operator-(Matrix33 *lhs,double s)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Matrix33 *in_RDI;
  
  dVar1 = (lhs->field_0).data[0][1];
  dVar2 = (lhs->field_0).data[0][2];
  dVar3 = (lhs->field_0).data[1][0];
  dVar4 = (lhs->field_0).data[1][1];
  dVar5 = (lhs->field_0).data[1][2];
  dVar6 = (lhs->field_0).data[2][0];
  dVar7 = (lhs->field_0).data[2][1];
  dVar8 = (lhs->field_0).data[2][2];
  (in_RDI->field_0).data[0][0] = (lhs->field_0).data[0][0] - s;
  (in_RDI->field_0).data[0][1] = dVar1 - s;
  (in_RDI->field_0).data[0][2] = dVar2 - s;
  (in_RDI->field_0).data[1][0] = dVar3 - s;
  (in_RDI->field_0).data[1][1] = dVar4 - s;
  (in_RDI->field_0).data[1][2] = dVar5 - s;
  (in_RDI->field_0).data[2][0] = dVar6 - s;
  (in_RDI->field_0).data[2][1] = dVar7 - s;
  (in_RDI->field_0).data[2][2] = dVar8 - s;
  return in_RDI;
}

Assistant:

Matrix33 operator-(const Matrix33& lhs, double s) { return (Matrix33(lhs) -= s); }